

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

void __thiscall Dice::resolveDuringHand(Dice *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  string answer;
  int keepNumber;
  string next;
  string keep;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  int local_8c;
  long *local_88;
  char *local_80;
  long local_78 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
  *local_68;
  key_type local_60;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_40;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Y","");
  if (this->numberOfRolls == 0) goto LAB_001066a9;
  if (this->numberOfRolls == 1) {
    iVar4 = addToCount(this);
    if (iVar4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Selected None on 2nd role, forcing 3rd role and keeping",
                 0x37);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
LAB_00106699:
      resetResolvedHand(this);
      setResolvedHandToDiceValues(this);
      goto LAB_001066a9;
    }
  }
  if (this->numberOfRolls != 2) goto LAB_00105f29;
  local_a8 = 0;
  local_a0 = 0;
  local_b0 = &local_a0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)",
             0x52);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_b0);
  iVar4 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar4 == 0) {
LAB_00105f0a:
    resetResolvedHand(this);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_b0);
    if (iVar4 == 0) goto LAB_00105f0a;
    iVar4 = std::__cxx11::string::compare((char *)&local_b0);
    if (iVar4 == 0) goto LAB_00105f0a;
    iVar4 = addToCount(this);
    if (iVar4 == 6) {
      iVar4 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)&local_b0);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&local_b0);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)&local_b0);
              if (iVar4 != 0) goto LAB_00105f12;
            }
          }
        }
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
      }
LAB_001066a9:
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
LAB_00105f12:
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
LAB_00105f29:
  if (this->numberOfRolls == 1) {
    iVar4 = addToCount(this);
    if (iVar4 == 6) {
      std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x11c0e7);
    }
  }
  if (this->numberOfRolls == 1) {
    showResolvedHand(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You must select a total of 6 cards to resolve the hand",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  local_68 = &this->diceMap;
  local_38 = &this->DiceValues;
  local_40 = &this->resolvedHand;
LAB_00105fe9:
  while( true ) {
    iVar4 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar4 != 0) goto LAB_001066a9;
    }
    if (this->numberOfRolls != 1) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "------------------------------------------------------------------",0x42);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f
           | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Which dice do you want to keep?",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "------------------------------------------------------------------",0x42);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f
           | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"All - Type: All , this will discard roll 2 & 3",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f
           | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"None - Type: None or N, this will force the next roll",0x35)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xffffff4f
           | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks...",0x47);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "------------------------------------------------------------------",0x42);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    if (this->numberOfRolls == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved"
                 ,0x54);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    std::operator>>((istream *)&std::cin,(string *)&local_60);
    sVar3 = local_60._M_string_length;
    _Var2._M_p = local_60._M_dataplus._M_p;
    if (local_60._M_string_length != 0) {
      sVar8 = 0;
      do {
        iVar4 = toupper((int)_Var2._M_p[sVar8]);
        _Var2._M_p[sVar8] = (char)iVar4;
        sVar8 = sVar8 + 1;
      } while (sVar3 != sVar8);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) break;
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) break;
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) {
LAB_0010661d:
      std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,0x11c0e7);
      goto LAB_001066a9;
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) goto LAB_0010661d;
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) goto LAB_0010661d;
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) {
LAB_001063df:
      if (this->numberOfRolls != 1) goto LAB_00106411;
      addDiceValuesToResolvedHand(this);
      pcVar7 = "N";
      goto LAB_001063f7;
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) goto LAB_001063df;
    iVar4 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar4 == 0) goto LAB_001063df;
LAB_00106411:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  ",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&local_8c);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
             ::operator[](local_68,&local_60);
    pmVar6 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](local_38,pmVar5);
    iVar4 = local_8c;
    if (local_8c <= *pmVar6) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Dice::DiceOptions>_>_>
               ::operator[](local_68,&local_60);
      pmVar6 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](local_40,pmVar5);
      *pmVar6 = *pmVar6 + iVar4;
      if (this->numberOfRolls == 1) {
        iVar4 = addToCount(this);
        pcVar7 = "N";
        if (iVar4 == 6) goto LAB_001063f7;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Do you have another selection for dice you wish to keep? Y=Yes, N=No  ",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      std::operator>>((istream *)&std::cin,(string *)&local_88);
      pcVar7 = local_80;
      plVar1 = local_88;
      if (local_80 != (char *)0x0) {
        pcVar9 = (char *)0x0;
        do {
          iVar4 = toupper((int)*(char *)((long)plVar1 + (long)pcVar9));
          *(char *)((long)plVar1 + (long)pcVar9) = (char)iVar4;
          pcVar9 = pcVar9 + 1;
        } while (pcVar7 != pcVar9);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar4 != 0) goto code_r0x001065ae;
      }
      goto LAB_001066a9;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You cannot select more than is currently available",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  if (this->numberOfRolls < 2) goto LAB_00106699;
  addDiceValuesToResolvedHand(this);
  goto LAB_001066a9;
code_r0x001065ae:
  if (this->numberOfRolls == 1) {
    iVar4 = addToCount(this);
    if (iVar4 != 6) {
      showResolvedHand(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "You must select a total of 6 cards to finish with. Please select more cards",0x4b)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      pcVar7 = "Y";
LAB_001063f7:
      std::__cxx11::string::_M_replace((ulong)&local_88,0,local_80,(ulong)pcVar7);
    }
  }
  goto LAB_00105fe9;
}

Assistant:

void Dice::resolveDuringHand() {
    string keep;
    int keepNumber;
    string next = "Y";

    if (this->getNumbOfRollsRemaining() == 0) {
        return;
    }
    if (this->getNumbOfRollsRemaining() == 1 && addToCount() == 0) {
        cout << "Selected None on 2nd role, forcing 3rd role and keeping" << endl;
        resetResolvedHand();
        setResolvedHandToDiceValues();
        return;
    }
    if (getNumbOfRollsRemaining() == 2) {
        string answer;
        cout << "Do you want to throw your 1st roll keeps to select more dice on 3rd roll? (Y or N)" << endl;
        cin >> answer;
        if (answer == "Y" || answer == "Yes" || answer == "y") {
            resetResolvedHand();
        }
        else if (addToCount()==6 && (answer == "N" || answer == "n" || answer == "NO" || answer == "No" || answer == "no")){
            return;
        }
    }

    if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
        next = "N";
    }

    if(getNumbOfRollsRemaining() == 1) {
        showResolvedHand();
        cout << "You must select a total of 6 cards to resolve the hand" << endl;
    }

    while (next == "YES" || next == "Y") {
        if(getNumbOfRollsRemaining() != 1) {
            cout << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "Which dice do you want to keep?" << endl;
            cout << "------------------------------------------------------------------" << endl;
            cout << left << "| " << "All - Type: All , this will discard roll 2 & 3" << endl;
            cout << left << "| " << "None - Type: None or N, this will force the next roll" << endl;
            cout << left << "| " << "Some - Type first letter of type (Dice Type: Char) Ex= A for Attacks..." << endl;
            cout << "------------------------------------------------------------------" << endl;

        }

        if(getNumbOfRollsRemaining() == 1) {
            cout << "Rest - Type: Rest , this will take the rest of roll 3 and add it to current resolved" << endl;
        }
        cin >> keep;
        transform(keep.begin(), keep.end(), keep.begin(), ::toupper);
        if(keep == "All" || keep == "ALL") {
            if(getNumbOfRollsRemaining() > 1 ) {
                addDiceValuesToResolvedHand();
                break;
            }
            else{
                resetResolvedHand();
                setResolvedHandToDiceValues();
                break;
            }
        }

        if(keep == "NONE" || keep == "None" || keep == "N") {
            next = "N";
            break;
        }
        if ((keep == "Rest" || keep == "rest" || keep == "REST") && getNumbOfRollsRemaining() == 1)  {
            addDiceValuesToResolvedHand();
            next = "N";
            continue;
        }

        else {
            cout << "How many of the selected dice do you want to keep? Ex= 2 for 2 Attacks  " << endl;
            cin >> keepNumber;
            if(DiceValues[diceMap[keep]] < keepNumber)
            {
                cout << "You cannot select more than is currently available" << endl;
                continue;
            }
            resolvedHand[diceMap[keep]] += keepNumber;
            if(getNumbOfRollsRemaining() == 1 && addToCount()==6) {
                next = "N";
                continue;
            }
            cout << "Do you have another selection for dice you wish to keep? Y=Yes, N=No  " << endl;
            cin >> next;
            transform(next.begin(), next.end(), next.begin(), ::toupper);
            if(next == "N" || next == "NO"){
                return;
            }
            if (getNumbOfRollsRemaining() == 1 && addToCount()!=6){
            showResolvedHand();
            cout << "You must select a total of 6 cards to finish with. Please select more cards" << endl;
            next = "Y";
            continue;
            }
        }

    }
}